

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

void hide_shlib_symbols(GlobalVars *gv)

{
  int i;
  long lVar1;
  Symbol *pSVar2;
  Symbol **ppSVar3;
  Symbol **ppSVar4;
  
  lVar1 = 0;
  do {
    pSVar2 = gv->symbols[lVar1];
    if (pSVar2 != (Symbol *)0x0) {
      ppSVar3 = gv->symbols + lVar1;
      do {
        ppSVar4 = &pSVar2->glob_chain;
        if ((pSVar2->flags & 0x12) == 0x10) {
          *ppSVar3 = *ppSVar4;
          *ppSVar4 = (Symbol *)0x0;
          ppSVar4 = ppSVar3;
        }
        pSVar2 = *ppSVar4;
        ppSVar3 = ppSVar4;
      } while (pSVar2 != (Symbol *)0x0);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10000);
  return;
}

Assistant:

void hide_shlib_symbols(struct GlobalVars *gv)
/* scan for all unreferenced SYMF_SHLIB symbols in the global symbol list
   and remove them - they have to be invisible for the file we create */
{
  int i;

  for (i=0; i<SYMHTABSIZE; i++) {
    struct Symbol *sym;
    struct Symbol **chain = &gv->symbols[i];

    while (sym = *chain) {
      if ((sym->flags & SYMF_SHLIB) && !(sym->flags & SYMF_REFERENCED)) {
        /* remove from global symbol list */
        *chain = sym->glob_chain;
        sym->glob_chain = NULL;
      }
      else
        chain = &sym->glob_chain;
    }        
  }
}